

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klibexec.h
# Opt level: O0

void KDict_DoEach(KonohaContext *kctx,KDict *dict,void *thunk,
                 _func_void_KonohaContext_ptr_void_ptr_KKeyValue_ptr *f)

{
  ulong uVar1;
  long lVar2;
  code *in_RCX;
  undefined8 in_RDX;
  ulong *in_RSI;
  undefined8 in_RDI;
  KKeyValue *kvs;
  size_t size;
  size_t i;
  ulong local_28;
  
  uVar1 = *in_RSI;
  for (local_28 = 0; local_28 < uVar1 >> 4; local_28 = local_28 + 1) {
    lVar2 = in_RSI[1] + local_28 * 0x10;
    if ((*(int *)(lVar2 + 4) != 0) || (*(long *)(lVar2 + 8) != 0)) {
      (*in_RCX)(in_RDI,in_RDX,lVar2);
    }
  }
  return;
}

Assistant:

KLIBDECL void KDict_DoEach(KonohaContext *kctx, KDict *dict, void *thunk, void (*f)(KonohaContext*, void *, KKeyValue *))
{
	size_t i, size = KDict_size(dict);
	for(i = 0; i < size; i++) {
		KKeyValue *kvs = dict->data.keyValueItems + i;
		if(kvs->typeAttr == 0 && kvs->unboxValue == 0) continue;
		f(kctx, thunk, kvs);
	}
}